

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O2

void HPDF_PadOrTrancatePasswd(char *pwd,HPDF_BYTE *new_pwd)

{
  HPDF_UINT HVar1;
  
  HVar1 = HPDF_StrLen(pwd,0x21);
  HPDF_MemSet(new_pwd,'\0',0x20);
  if (HVar1 < 0x20) {
    if (HVar1 != 0) {
      HPDF_MemCpy(new_pwd,(HPDF_BYTE *)pwd,HVar1);
    }
    new_pwd = new_pwd + HVar1;
    HVar1 = 0x20 - HVar1;
    pwd = (char *)HPDF_PADDING_STRING;
  }
  else {
    HVar1 = 0x20;
  }
  HPDF_MemCpy(new_pwd,(HPDF_BYTE *)pwd,HVar1);
  return;
}

Assistant:

void
HPDF_PadOrTrancatePasswd  (const char  *pwd,
                           HPDF_BYTE        *new_pwd)
{
    HPDF_UINT len = HPDF_StrLen (pwd, HPDF_PASSWD_LEN + 1);

    HPDF_PTRACE((" HPDF_PadOrTrancatePasswd\n"));

    HPDF_MemSet (new_pwd, 0x00, HPDF_PASSWD_LEN);

    if (len >= HPDF_PASSWD_LEN) {
        HPDF_MemCpy (new_pwd, (HPDF_BYTE *)pwd, HPDF_PASSWD_LEN);
    } else {
        if (len > 0) {
            HPDF_MemCpy (new_pwd, (HPDF_BYTE *)pwd, len);
        }
        HPDF_MemCpy (new_pwd + len, HPDF_PADDING_STRING, HPDF_PASSWD_LEN - len);
    }
}